

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int str_lower(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *p;
  char *s;
  luaL_Buffer b;
  size_t i;
  size_t l;
  lua_State *L_local;
  
  l = (size_t)L;
  pcVar2 = luaL_checklstring(L,1,&i);
  pcVar3 = luaL_buffinitsize((lua_State *)l,(luaL_Buffer *)&s,i);
  b.initb[0x1ff8] = '\0';
  b.initb[0x1ff9] = '\0';
  b.initb[0x1ffa] = '\0';
  b.initb[0x1ffb] = '\0';
  b.initb[0x1ffc] = '\0';
  b.initb[0x1ffd] = '\0';
  b.initb[0x1ffe] = '\0';
  b.initb[0x1fff] = '\0';
  for (; (ulong)b.initb._8184_8_ < i; b.initb._8184_8_ = b.initb._8184_8_ + 1) {
    iVar1 = tolower((uint)(byte)pcVar2[b.initb._8184_8_]);
    pcVar3[b.initb._8184_8_] = (char)iVar1;
  }
  luaL_pushresultsize((luaL_Buffer *)&s,i);
  return 1;
}

Assistant:

static int str_lower (lua_State *L) {
  size_t l;
  size_t i;
  luaL_Buffer b;
  const char *s = luaL_checklstring(L, 1, &l);
  char *p = luaL_buffinitsize(L, &b, l);
  for (i=0; i<l; i++)
    p[i] = tolower(uchar(s[i]));
  luaL_pushresultsize(&b, l);
  return 1;
}